

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotBarsHEx<ImPlot::GetterBarH<double>,double>
               (char *label_id,GetterBarH<double> *getter,double height)

{
  ImPlotNextItemData *col;
  ImVec2 IVar1;
  bool bVar2;
  ImPlotContext *pIVar3;
  bool bVar4;
  ImU32 col_00;
  ImU32 col_01;
  ImDrawList *this;
  int iVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ImVec2 a;
  ImVec2 b;
  ImPlotPoint local_48;
  ImVec2 local_38;
  
  bVar4 = BeginItem(label_id,1);
  if (bVar4) {
    dVar7 = height * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar5 = getter->Count, 0 < iVar5)) {
      iVar6 = 0;
      do {
        IVar1 = *(ImVec2 *)
                 ((long)getter->Xs +
                 (long)(((getter->Offset + iVar6) % iVar5 + iVar5) % iVar5) * (long)getter->Stride);
        dVar8 = (double)iVar6 + getter->YShift;
        local_48.y = dVar8 - dVar7;
        local_48.x = 0.0;
        FitPoint(&local_48);
        local_48.y = dVar8 + dVar7;
        local_48.x = (double)IVar1;
        FitPoint(&local_48);
        iVar6 = iVar6 + 1;
        iVar5 = getter->Count;
      } while (iVar6 < iVar5);
    }
    pIVar3 = GImPlot;
    col = &GImPlot->NextItemData;
    this = GetPlotDrawList();
    col_00 = ImGui::GetColorU32(col->Colors);
    col_01 = ImGui::GetColorU32((pIVar3->NextItemData).Colors + 1);
    iVar5 = getter->Count;
    if (0 < iVar5) {
      bVar4 = (pIVar3->NextItemData).RenderFill;
      bVar2 = (pIVar3->NextItemData).RenderLine;
      iVar6 = 0;
      do {
        dVar8 = *(double *)
                 ((long)getter->Xs +
                 (long)(((getter->Offset + iVar6) % iVar5 + iVar5) % iVar5) * (long)getter->Stride);
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          dVar9 = (double)iVar6 + getter->YShift;
          local_48.x = (double)PlotToPixels(0.0,dVar9 - dVar7,-1);
          local_38 = PlotToPixels(dVar8,dVar9 + dVar7,-1);
          if ((pIVar3->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,(ImVec2 *)&local_48,&local_38,col_01,0.0,0xf);
          }
          if (((bVar4 ^ 1U | col_00 != col_01) & bVar2) != 0) {
            ImDrawList::AddRect(this,(ImVec2 *)&local_48,&local_38,col_00,0.0,0xf,
                                (pIVar3->NextItemData).LineWeight);
          }
        }
        iVar6 = iVar6 + 1;
        iVar5 = getter->Count;
      } while (iVar6 < iVar5);
    }
    pIVar3 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar3->NextItemData);
    pIVar3->PreviousItem = pIVar3->CurrentItem;
    pIVar3->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsHEx(const char* label_id, const Getter& getter, THeight height) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const THeight half_height = height / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(0, p.y - half_height));
                FitPoint(ImPlotPoint(p.x, p.y + half_height));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.x == 0)
                continue;
            ImVec2 a = PlotToPixels(0, p.y - half_height);
            ImVec2 b = PlotToPixels(p.x, p.y + half_height);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawCornerFlags_All, s.LineWeight);
        }
        EndItem();
    }
}